

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curl.cpp
# Opt level: O3

Response * __thiscall
arbiter::http::Curl::get
          (Response *__return_storage_ptr__,Curl *this,string *path,Headers *headers,Query *query,
          size_t reserve,size_t timeout)

{
  _Rb_tree_node_base *this_00;
  _Rb_tree_header *p_Var1;
  pointer pcVar2;
  int code;
  _Base_ptr p_Var3;
  _Base_ptr p_Var4;
  vector<char,_std::allocator<char>_> data;
  Headers receivedHeaders;
  vector<char,_std::allocator<char>_> local_b8;
  undefined1 *local_a0 [2];
  undefined1 local_90 [16];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_80;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  local_b8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  local_b8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  local_b8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  if (reserve != 0) {
    ::std::vector<char,_std::allocator<char>_>::reserve(&local_b8,reserve);
  }
  pcVar2 = (path->_M_dataplus)._M_p;
  local_a0[0] = local_90;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)local_a0,pcVar2,pcVar2 + path->_M_string_length);
  init(this,(EVP_PKEY_CTX *)local_a0);
  if (local_a0[0] != local_90) {
    operator_delete(local_a0[0]);
  }
  if (timeout != 0) {
    curl_easy_setopt(this->m_curl,0x14,timeout);
  }
  curl_easy_setopt(this->m_curl,0x4e2b,anon_unknown_4::getCb);
  curl_easy_setopt(this->m_curl,0x2711,&local_b8);
  curl_easy_setopt(this->m_curl,0x2727,this->m_headers);
  p_Var1 = &local_80._M_impl.super__Rb_tree_header;
  local_80._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_80._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_80._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_80._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  local_80._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  curl_easy_setopt(this->m_curl,0x4e6f,anon_unknown_4::headerCb);
  curl_easy_setopt(this->m_curl,0x272d,&local_80);
  code = perform(this);
  if ((_Rb_tree_header *)local_80._M_impl.super__Rb_tree_header._M_header._M_left == p_Var1) {
LAB_0016f8b6:
    Response::Response(__return_storage_ptr__,code,&local_b8,(Headers *)&local_80);
    ::std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree(&local_80);
    if (local_b8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_b8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    return __return_storage_ptr__;
  }
  p_Var4 = local_80._M_impl.super__Rb_tree_header._M_header._M_left;
LAB_0016f838:
  p_Var3 = p_Var4[2]._M_parent;
  if (p_Var3 != (_Base_ptr)0x0) {
    this_00 = p_Var4 + 2;
    do {
      if (**(char **)this_00 != ' ') goto LAB_0016f88a;
      ::std::__cxx11::string::substr((ulong)local_50,(ulong)this_00);
      ::std::__cxx11::string::operator=((string *)this_00,(string *)local_50);
      if (local_50[0] != local_40) {
        operator_delete(local_50[0]);
      }
      p_Var3 = p_Var4[2]._M_parent;
    } while (p_Var3 != (_Base_ptr)0x0);
  }
  goto LAB_0016f8a6;
  while( true ) {
    ::std::__cxx11::string::pop_back();
    p_Var3 = p_Var4[2]._M_parent;
    if (p_Var3 == (_Base_ptr)0x0) break;
LAB_0016f88a:
    if (*(char *)(*(long *)this_00 + -1 + (long)p_Var3) != ' ') break;
  }
LAB_0016f8a6:
  p_Var4 = (_Base_ptr)::std::_Rb_tree_increment(p_Var4);
  if ((_Rb_tree_header *)p_Var4 == p_Var1) goto LAB_0016f8b6;
  goto LAB_0016f838;
}

Assistant:

Response Curl::get(
        std::string path,
        Headers headers,
        Query query,
        const std::size_t reserve,
        const std::size_t timeout)
{
#ifdef ARBITER_CURL
    std::vector<char> data;

    if (reserve) data.reserve(reserve);

    init(path, headers, query);
    if (timeout) curl_easy_setopt(m_curl, CURLOPT_LOW_SPEED_TIME, timeout);

    // Register callback function and data pointer to consume the result.
    curl_easy_setopt(m_curl, CURLOPT_WRITEFUNCTION, getCb);
    curl_easy_setopt(m_curl, CURLOPT_WRITEDATA, &data);

    // Insert all headers into the request.
    curl_easy_setopt(m_curl, CURLOPT_HTTPHEADER, m_headers);

    // Set up callback and data pointer for received headers.
    Headers receivedHeaders;
    curl_easy_setopt(m_curl, CURLOPT_HEADERFUNCTION, headerCb);
    curl_easy_setopt(m_curl, CURLOPT_HEADERDATA, &receivedHeaders);

    // Run the command.
    const int httpCode(perform());

    for (auto& h : receivedHeaders)
    {
        std::string& v(h.second);
        while (v.size() && v.front() == ' ') v = v.substr(1);
        while (v.size() && v.back() == ' ') v.pop_back();
    }

    return Response(httpCode, data, receivedHeaders);
#else
    throw ArbiterError(fail);
#endif
}